

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O3

void __thiscall
deqp::gls::TextureSamplerTest::renderReferences
          (TextureSamplerTest *this,Surface *textureRef,Surface *samplerRef,int x,int y)

{
  SamplingState *pSVar1;
  RenderContext *pRVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  SamplingState state;
  SamplingState state_00;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int iVar16;
  GLuint GVar17;
  GLenum GVar18;
  undefined4 extraout_var;
  void *pvVar19;
  GLuint texture;
  GLuint local_8c;
  TextureFormat local_88;
  Surface *local_80;
  undefined8 uStack_78;
  undefined4 uStack_70;
  undefined4 local_6c;
  undefined4 uStack_68;
  undefined8 uStack_64;
  PixelBufferAccess local_58;
  Functions *gl;
  
  local_80 = samplerRef;
  iVar16 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar16);
  GVar17 = createTexture(gl,this->m_target);
  local_8c = GVar17;
  (*gl->viewport)(x,y,0x80,0x80);
  GVar18 = (*gl->getError)();
  glu::checkError(GVar18,"glViewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x1ed);
  (*gl->bindTexture)(this->m_target,GVar17);
  GVar18 = (*gl->getError)();
  glu::checkError(GVar18,"glBindTexture(m_target, texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x1f0);
  uVar3 = (this->m_textureState).wrapR;
  uStack_64._0_4_ = (this->m_textureState).minLod;
  uStack_64._4_4_ = (this->m_textureState).maxLod;
  pSVar1 = &this->m_textureState;
  uStack_78._0_4_ = pSVar1->minFilter;
  uStack_78._4_4_ = pSVar1->magFilter;
  uVar4 = (this->m_textureState).wrapT;
  uVar5 = (this->m_textureState).wrapS;
  uVar13 = pSVar1->minFilter;
  uVar14 = pSVar1->magFilter;
  uVar15 = pSVar1->wrapT;
  state.wrapT = uVar15;
  state.magFilter = uVar14;
  state.minFilter = uVar13;
  state.wrapS = uVar5;
  state.wrapR = uVar3;
  state.minLod = (GLfloat)(undefined4)uStack_64;
  state.maxLod = (GLfloat)uStack_64._4_4_;
  uStack_70 = uVar4;
  local_6c = uVar5;
  uStack_68 = uVar3;
  setTextureState(gl,this->m_target,state);
  render(this);
  pRVar2 = this->m_renderCtx;
  local_88.order = RGBA;
  local_88.type = UNORM_INT8;
  pvVar19 = (void *)(textureRef->m_pixels).m_cap;
  if (pvVar19 != (void *)0x0) {
    pvVar19 = (textureRef->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,&local_88,textureRef->m_width,textureRef->m_height,1,pvVar19);
  glu::readPixels(pRVar2,x,y,&local_58);
  uVar6 = (this->m_samplerState).wrapS;
  uVar10 = (this->m_samplerState).minFilter;
  uVar11 = (this->m_samplerState).magFilter;
  uVar12 = (this->m_samplerState).wrapT;
  state_00.wrapT = uVar12;
  state_00.magFilter = uVar11;
  state_00.minFilter = uVar10;
  uVar7 = (this->m_samplerState).wrapR;
  uVar8 = (this->m_samplerState).minLod;
  uVar9 = (this->m_samplerState).maxLod;
  state_00.maxLod = (GLfloat)uVar9;
  state_00.minLod = (GLfloat)uVar8;
  state_00.wrapS = uVar6;
  state_00.wrapR = uVar7;
  setTextureState(gl,this->m_target,state_00);
  render(this);
  pRVar2 = this->m_renderCtx;
  local_88.order = RGBA;
  local_88.type = UNORM_INT8;
  pvVar19 = (void *)(local_80->m_pixels).m_cap;
  if (pvVar19 != (void *)0x0) {
    pvVar19 = (local_80->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,&local_88,local_80->m_width,local_80->m_height,1,pvVar19);
  glu::readPixels(pRVar2,x,y,&local_58);
  (*gl->deleteTextures)(1,&local_8c);
  GVar18 = (*gl->getError)();
  glu::checkError(GVar18,"glDeleteTextures(1, &texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x1fb);
  return;
}

Assistant:

void TextureSamplerTest::renderReferences (tcu::Surface& textureRef, tcu::Surface& samplerRef, int x, int y)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	GLuint					texture	= createTexture(gl, m_target);

	gl.viewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT)");

	gl.bindTexture(m_target, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, texture)");

	setTextureState(gl, m_target, m_textureState);
	render();
	glu::readPixels(m_renderCtx, x, y, textureRef.getAccess());

	setTextureState(gl, m_target, m_samplerState);
	render();
	glu::readPixels(m_renderCtx, x, y, samplerRef.getAccess());

	gl.deleteTextures(1, &texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures(1, &texture)");
}